

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psusan.c
# Opt level: O0

Plug * server_conn_plug(server_config *cfg,server_instance **inst_out)

{
  uint uVar1;
  server_instance *__s;
  Plug *pPVar2;
  server_instance *inst;
  server_instance **inst_out_local;
  server_config *cfg_local;
  
  __s = (server_instance *)safemalloc(1,0x10,0);
  memset(__s,0,0x10);
  uVar1 = cfg->next_id;
  cfg->next_id = uVar1 + 1;
  __s->id = uVar1;
  (__s->logpolicy).vt = &server_logpolicy_vt;
  if (inst_out != (server_instance **)0x0) {
    *inst_out = __s;
  }
  pPVar2 = ssh_server_plug(cfg->conf,cfg->ssc,(ssh_key **)0x0,0,(RSAKey *)0x0,(AuthPolicy *)0x0,
                           &__s->logpolicy,&unix_live_sftpserver_vt);
  return pPVar2;
}

Assistant:

static Plug *server_conn_plug(
    struct server_config *cfg, struct server_instance **inst_out)
{
    struct server_instance *inst = snew(struct server_instance);

    memset(inst, 0, sizeof(*inst));

    inst->id = cfg->next_id++;
    inst->logpolicy.vt = &server_logpolicy_vt;

    if (inst_out)
        *inst_out = inst;

    return ssh_server_plug(
        cfg->conf, cfg->ssc, NULL, 0, NULL, NULL,
        &inst->logpolicy, &unix_live_sftpserver_vt);
}